

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# only_one_enum_test.pb.cc
# Opt level: O2

bool proto2_unittest::OnlyOneEnum_Parse(string_view name,OnlyOneEnum *value)

{
  bool bVar1;
  int *in_R9;
  string_view name_00;
  int int_value;
  
  name_00._M_str = (char *)&int_value;
  name_00._M_len = (size_t)name._M_str;
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((internal *)OnlyOneEnum_entries,(EnumEntry *)0x2,name._M_len,name_00,in_R9);
  if (bVar1) {
    *value = int_value;
  }
  return bVar1;
}

Assistant:

bool OnlyOneEnum_Parse(::absl::string_view name, OnlyOneEnum* PROTOBUF_NONNULL value) {
  int int_value;
  bool success = ::google::protobuf::internal::LookUpEnumValue(
      OnlyOneEnum_entries, 2, name, &int_value);
  if (success) {
    *value = static_cast<OnlyOneEnum>(int_value);
  }
  return success;
}